

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.h
# Opt level: O0

string * __thiscall
cmConnectionBufferStrategy::BufferOutMessage
          (string *__return_storage_ptr__,cmConnectionBufferStrategy *this,string *rawBuffer)

{
  string *rawBuffer_local;
  cmConnectionBufferStrategy *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rawBuffer);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string BufferOutMessage(const std::string& rawBuffer) const
  {
    return rawBuffer;
  }